

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_nonblock_begin(nk_context *ctx,nk_flags flags,nk_rect body,nk_rect header,
                     nk_panel_type panel_type)

{
  byte *pbVar1;
  float fVar2;
  nk_window *pnVar3;
  nk_size nVar4;
  bool bVar5;
  nk_buffer *pnVar6;
  nk_handle nVar7;
  nk_size nVar8;
  nk_size nVar9;
  undefined4 uVar10;
  bool bVar11;
  int iVar12;
  nk_page_element *pnVar13;
  nk_page_element *ptr;
  nk_panel *pnVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  nk_rect r;
  
  fVar18 = header.x;
  fVar19 = header.y;
  fVar16 = body.x;
  fVar17 = body.y;
  pnVar3 = ctx->current;
  if (pnVar3 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4195,
                  "int nk_nonblock_begin(struct nk_context *, nk_flags, struct nk_rect, struct nk_rect, enum nk_panel_type)"
                 );
  }
  if (pnVar3->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4196,
                  "int nk_nonblock_begin(struct nk_context *, nk_flags, struct nk_rect, struct nk_rect, enum nk_panel_type)"
                 );
  }
  if ((pnVar3->layout->type &
      (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP)) !=
      NK_PANEL_NONE) {
    __assert_fail("!(panel->type & NK_PANEL_SET_POPUP)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x419d,
                  "int nk_nonblock_begin(struct nk_context *, nk_flags, struct nk_rect, struct nk_rect, enum nk_panel_type)"
                 );
  }
  pnVar13 = (nk_page_element *)(pnVar3->popup).win;
  if (pnVar13 == (nk_page_element *)0x0) {
    pnVar13 = nk_create_page_element(ctx);
    (pnVar13->data).tbl.seq = ctx->seq;
    (pnVar13->data).win.parent = pnVar3;
    (pnVar3->popup).win = (nk_window *)pnVar13;
    (pnVar3->popup).type = panel_type;
    (pnVar13->data).win.buffer.base = &ctx->memory;
    (pnVar13->data).tbl.keys[0x1e] = 1;
    nVar4 = (ctx->memory).allocated;
    (pnVar13->data).win.buffer.begin = nVar4;
    (pnVar13->data).win.buffer.end = nVar4;
    (pnVar13->data).win.buffer.last = nVar4;
  }
  else {
    bVar11 = true;
    bVar5 = true;
    if (ctx != (nk_context *)0x0) {
      if (((ctx->input).mouse.buttons[0].down == 0) || ((ctx->input).mouse.buttons[0].clicked == 0))
      {
        bVar5 = true;
      }
      else {
        bVar5 = false;
      }
    }
    if ((((ctx != (nk_context *)0x0) && (fVar2 = (ctx->input).mouse.pos.x, fVar16 <= fVar2)) &&
        (fVar2 < fVar16 + body.w)) && (fVar2 = (ctx->input).mouse.pos.y, fVar17 <= fVar2)) {
      bVar11 = fVar17 + body.h <= fVar2;
    }
    if (ctx == (nk_context *)0x0) {
LAB_0012e3b1:
      bVar15 = false;
    }
    else {
      fVar2 = (ctx->input).mouse.pos.x;
      bVar15 = false;
      if ((fVar18 <= fVar2) && (bVar15 = false, fVar2 < fVar18 + header.w)) {
        fVar2 = (ctx->input).mouse.pos.y;
        if (fVar2 < fVar19) goto LAB_0012e3b1;
        bVar15 = fVar2 < fVar19 + header.h;
      }
    }
    if (!bVar5) {
      bVar11 = (bool)(bVar11 | bVar15);
      goto LAB_0012e3cf;
    }
  }
  bVar11 = false;
LAB_0012e3cf:
  (pnVar3->popup).header.x = fVar18;
  (pnVar3->popup).header.y = fVar19;
  (pnVar3->popup).header.w = header.w;
  (pnVar3->popup).header.h = header.h;
  if (bVar11) {
    iVar12 = 0;
    for (pnVar14 = pnVar3->layout; pnVar14 != (nk_panel *)0x0; pnVar14 = pnVar14->parent) {
      pbVar1 = (byte *)((long)&pnVar14->flags + 2);
      *pbVar1 = *pbVar1 | 1;
    }
  }
  else {
    (pnVar13->data).pan.clip.w = fVar16;
    (pnVar13->data).pan.clip.h = fVar17;
    (pnVar13->data).pan.menu.x = body.w;
    (pnVar13->data).pan.menu.y = body.h;
    (pnVar13->data).win.parent = pnVar3;
    ptr = nk_create_page_element(ctx);
    nk_zero(ptr,0x200);
    (pnVar13->data).win.layout = (nk_panel *)ptr;
    (pnVar13->data).tbl.keys[0x10] = flags | 0x801;
    (pnVar13->data).tbl.seq = ctx->seq;
    (pnVar3->popup).active = 1;
    if (ptr == (nk_page_element *)0x0) {
      __assert_fail("popup->layout",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                    ,0x41c3,
                    "int nk_nonblock_begin(struct nk_context *, nk_flags, struct nk_rect, struct nk_rect, enum nk_panel_type)"
                   );
    }
    nVar4 = (pnVar3->buffer).end;
    (pnVar3->popup).buf.begin = nVar4;
    (pnVar3->popup).buf.end = nVar4;
    (pnVar3->popup).buf.parent = (pnVar3->buffer).last;
    (pnVar3->popup).buf.last = nVar4;
    (pnVar3->popup).buf.active = 1;
    pnVar6 = (pnVar3->buffer).base;
    fVar18 = (pnVar3->buffer).clip.x;
    fVar19 = (pnVar3->buffer).clip.y;
    fVar16 = (pnVar3->buffer).clip.w;
    fVar17 = (pnVar3->buffer).clip.h;
    iVar12 = (pnVar3->buffer).use_clipping;
    uVar10 = *(undefined4 *)&(pnVar3->buffer).field_0x1c;
    nVar7 = (pnVar3->buffer).userdata;
    nVar4 = (pnVar3->buffer).begin;
    nVar8 = (pnVar3->buffer).last;
    (pnVar13->data).win.buffer.end = (pnVar3->buffer).end;
    (pnVar13->data).win.buffer.last = nVar8;
    (pnVar13->data).win.buffer.userdata = nVar7;
    (pnVar13->data).win.buffer.begin = nVar4;
    *(float *)((long)&pnVar13->data + 0x78) = fVar16;
    *(float *)((long)&pnVar13->data + 0x7c) = fVar17;
    *(int *)((long)&pnVar13->data + 0x80) = iVar12;
    *(undefined4 *)((long)&pnVar13->data + 0x84) = uVar10;
    (pnVar13->data).win.buffer.base = pnVar6;
    *(float *)((long)&pnVar13->data + 0x70) = fVar18;
    *(float *)((long)&pnVar13->data + 0x74) = fVar19;
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(&(pnVar13->data).win.buffer,r);
    ctx->current = (nk_window *)pnVar13;
    nk_panel_begin(ctx,(char *)0x0,panel_type);
    fVar16 = *(float *)((long)&pnVar13->data + 0x70);
    fVar17 = *(float *)((long)&pnVar13->data + 0x74);
    fVar18 = *(float *)((long)&pnVar13->data + 0x78);
    fVar19 = *(float *)((long)&pnVar13->data + 0x7c);
    iVar12 = *(int *)((long)&pnVar13->data + 0x80);
    uVar10 = *(undefined4 *)((long)&pnVar13->data + 0x84);
    nVar7 = (pnVar13->data).win.buffer.userdata;
    nVar4 = (pnVar13->data).win.buffer.begin;
    nVar8 = (pnVar13->data).win.buffer.end;
    nVar9 = (pnVar13->data).win.buffer.last;
    (pnVar3->buffer).base = (pnVar13->data).win.buffer.base;
    (pnVar3->buffer).clip.x = fVar16;
    (pnVar3->buffer).clip.y = fVar17;
    (pnVar3->buffer).clip.w = fVar18;
    (pnVar3->buffer).clip.h = fVar19;
    (pnVar3->buffer).use_clipping = iVar12;
    *(undefined4 *)&(pnVar3->buffer).field_0x1c = uVar10;
    (pnVar3->buffer).userdata = nVar7;
    (pnVar3->buffer).begin = nVar4;
    (pnVar3->buffer).end = nVar8;
    (pnVar3->buffer).last = nVar9;
    pnVar14 = (pnVar13->data).win.layout;
    pnVar14->parent = pnVar3->layout;
    pnVar14->offset_x = (nk_uint *)((long)&pnVar13->data + 0x5c);
    pnVar14->offset_y = (nk_uint *)((long)&pnVar13->data + 0x60);
    iVar12 = 1;
    for (pnVar14 = pnVar3->layout; pnVar14 != (nk_panel *)0x0; pnVar14 = pnVar14->parent) {
      pbVar1 = (byte *)((long)&pnVar14->flags + 1);
      *pbVar1 = *pbVar1 | 0x10;
    }
  }
  return iVar12;
}

Assistant:

NK_LIB int
nk_nonblock_begin(struct nk_context *ctx,
    nk_flags flags, struct nk_rect body, struct nk_rect header,
    enum nk_panel_type panel_type)
{
    struct nk_window *popup;
    struct nk_window *win;
    struct nk_panel *panel;
    int is_active = nk_true;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    /* popups cannot have popups */
    win = ctx->current;
    panel = win->layout;
    NK_ASSERT(!(panel->type & NK_PANEL_SET_POPUP));
    (void)panel;
    popup = win->popup.win;
    if (!popup) {
        /* create window for nonblocking popup */
        popup = (struct nk_window*)nk_create_window(ctx);
        popup->parent = win;
        win->popup.win = popup;
        win->popup.type = panel_type;
        nk_command_buffer_init(&popup->buffer, &ctx->memory, NK_CLIPPING_ON);
    } else {
        /* close the popup if user pressed outside or in the header */
        int pressed, in_body, in_header;
        pressed = nk_input_is_mouse_pressed(&ctx->input, NK_BUTTON_LEFT);
        in_body = nk_input_is_mouse_hovering_rect(&ctx->input, body);
        in_header = nk_input_is_mouse_hovering_rect(&ctx->input, header);
        if (pressed && (!in_body || in_header))
            is_active = nk_false;
    }
    win->popup.header = header;

    if (!is_active) {
        /* remove read only mode from all parent panels */
        struct nk_panel *root = win->layout;
        while (root) {
            root->flags |= NK_WINDOW_REMOVE_ROM;
            root = root->parent;
        }
        return is_active;
    }
    popup->bounds = body;
    popup->parent = win;
    popup->layout = (struct nk_panel*)nk_create_panel(ctx);
    popup->flags = flags;
    popup->flags |= NK_WINDOW_BORDER;
    popup->flags |= NK_WINDOW_DYNAMIC;
    popup->seq = ctx->seq;
    win->popup.active = 1;
    NK_ASSERT(popup->layout);

    nk_start_popup(ctx, win);
    popup->buffer = win->buffer;
    nk_push_scissor(&popup->buffer, nk_null_rect);
    ctx->current = popup;

    nk_panel_begin(ctx, 0, panel_type);
    win->buffer = popup->buffer;
    popup->layout->parent = win->layout;
    popup->layout->offset_x = &popup->scrollbar.x;
    popup->layout->offset_y = &popup->scrollbar.y;

    /* set read only mode to all parent panels */
    {struct nk_panel *root;
    root = win->layout;
    while (root) {
        root->flags |= NK_WINDOW_ROM;
        root = root->parent;
    }}
    return is_active;
}